

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O2

aspa_verification_result
aspa_verify_as_path(aspa_table *aspa_table,uint32_t *as_path,size_t len,aspa_direction direction)

{
  long lVar1;
  long lVar2;
  aspa_hop_result aVar3;
  aspa_hop_result aVar4;
  aspa_verification_result aVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aVar5 = ASPA_AS_PATH_UNKNOWN;
  if (direction == ASPA_DOWNSTREAM) {
    if (aspa_table == (aspa_table *)0x0) goto LAB_0010d1c0;
    if (len < 3) {
LAB_0010d23e:
      aVar5 = ASPA_AS_PATH_VALID;
      goto LAB_0010d241;
    }
    pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
    uVar8 = len - 1;
    do {
      uVar6 = uVar8;
      if (uVar6 == 0) {
        aVar3 = ASPA_PROVIDER_PLUS;
        break;
      }
      aVar3 = aspa_check_hop(aspa_table,as_path[uVar6],as_path[uVar6 - 1]);
      uVar8 = uVar6 - 1;
    } while (aVar3 == ASPA_PROVIDER_PLUS);
    lVar2 = 1;
    do {
      lVar7 = lVar2;
      if (uVar6 + 1 == lVar7) {
        aVar4 = ASPA_PROVIDER_PLUS;
        uVar8 = uVar6;
        goto LAB_0010d22a;
      }
      aVar4 = aspa_check_hop(aspa_table,as_path[lVar7 + -1],as_path[lVar7]);
      lVar2 = lVar7 + 1;
    } while (aVar4 == ASPA_PROVIDER_PLUS);
    uVar8 = lVar7 - 1U;
    if (uVar6 < lVar7 - 1U) {
      __assert_fail("l <= r",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa_verification.c"
                    ,0xb8,
                    "enum aspa_verification_result aspa_verify_as_path_downstream(struct aspa_table *, uint32_t *, size_t)"
                   );
    }
LAB_0010d22a:
    if (uVar6 - uVar8 < 2) {
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      goto LAB_0010d23e;
    }
    uVar8 = uVar8 + 1;
    while (aVar3 != ASPA_NOT_PROVIDER_PLUS) {
      if (uVar6 <= uVar8) goto LAB_0010d2ef;
      aVar3 = aspa_check_hop(aspa_table,as_path[uVar6],as_path[uVar6 - 1]);
      uVar6 = uVar6 - 1;
    }
    while (aVar4 != ASPA_NOT_PROVIDER_PLUS) {
      if (uVar6 <= uVar8) goto LAB_0010d2ef;
      aVar4 = aspa_check_hop(aspa_table,as_path[uVar8],as_path[uVar8 + 1]);
      uVar8 = uVar8 + 1;
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
  }
  else {
    if (direction != ASPA_UPSTREAM) goto LAB_0010d241;
    if (aspa_table != (aspa_table *)0x0) {
      aVar5 = ASPA_AS_PATH_VALID;
      if (1 < len) {
        pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
        do {
          if (len == 1) goto LAB_0010d300;
          aVar3 = aspa_check_hop(aspa_table,as_path[len - 1],as_path[len - 2]);
          len = len - 1;
        } while (aVar3 == ASPA_PROVIDER_PLUS);
        if (aVar3 == ASPA_NOT_PROVIDER_PLUS) {
          aVar5 = ASPA_AS_PATH_INVALID;
        }
        else {
          aVar5 = ASPA_AS_PATH_INVALID;
          do {
            if (len == 0) {
              aVar5 = ASPA_AS_PATH_UNKNOWN;
              break;
            }
            aVar3 = aspa_check_hop(aspa_table,as_path[len],as_path[len - 1]);
            len = len - 1;
          } while (aVar3 != ASPA_NOT_PROVIDER_PLUS);
        }
LAB_0010d300:
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      }
      goto LAB_0010d241;
    }
LAB_0010d1c0:
    lrtr_dbg("ASPA: TRYING TO VALIDATE A AS_PATH BUT NO ASPA TABLE INITIALIZED");
  }
  aVar5 = ASPA_AS_PATH_INVALID;
LAB_0010d241:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return aVar5;
LAB_0010d2ef:
  pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
  aVar5 = ASPA_AS_PATH_UNKNOWN;
  goto LAB_0010d241;
}

Assistant:

aspa_verification_result aspa_verify_as_path(struct aspa_table *aspa_table, uint32_t as_path[],
								size_t len, enum aspa_direction direction)
{
	switch (direction) {
	case ASPA_UPSTREAM:
		return aspa_verify_as_path_upstream(aspa_table, as_path, len);
	case ASPA_DOWNSTREAM:
		return aspa_verify_as_path_downstream(aspa_table, as_path, len);
	}

	return ASPA_AS_PATH_UNKNOWN;
}